

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.hh
# Opt level: O3

string * __thiscall
tinyusdz::to_string<std::__cxx11::string>
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,uint32_t level)

{
  ostream *poVar1;
  ulong uVar2;
  uint32_t n;
  long lVar3;
  long lVar4;
  ulong uVar5;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)v & 0xffffffff),n);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  lVar4 = *(long *)this;
  if (*(long *)(this + 8) != lVar4) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      to_string(&local_1d8,(string *)(lVar4 + lVar3));
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      lVar4 = *(long *)this;
      uVar2 = *(long *)(this + 8) - lVar4 >> 5;
      if (uVar5 != uVar2 - 1) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        lVar4 = *(long *)this;
        uVar2 = *(long *)(this + 8) - lVar4 >> 5;
      }
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar5 < uVar2);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const std::vector<T> &v, const uint32_t level = 0) {
  std::stringstream ss;
  ss << pprint::Indent(level) << "[";

  // TODO(syoyo): indent for large array
  for (size_t i = 0; i < v.size(); i++) {
    ss << to_string(v[i]);
    if (i != (v.size() - 1)) {
      ss << ", ";
    }
  }
  ss << "]";
  return ss.str();
}